

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA.cpp
# Opt level: O2

void InitializeOutput(Arguments *args,DecPOMDPDiscreteInterface *decpomdp,QFunctionJAOHInterface *q,
                     bool GMAAusesBGIPSolver,string *filename,string *timingsFilename,
                     string *jpolFilename,ofstream *of,ofstream *of_jpol)

{
  string *__lhs;
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  undefined8 *puVar4;
  char *pcVar5;
  allocator<char> local_2b1;
  string *local_2b0;
  stat sb;
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  stringstream ss;
  ostream local_1a8 [376];
  
  if (args->dryrun == 0) {
    local_2b0 = filename;
    std::__cxx11::string::string<std::allocator<char>>((string *)&ss,"GMAA",(allocator<char> *)&sb);
    directories::MADPCreateResultsDir
              ((string *)&ss,
               (MultiAgentDecisionProcessInterface *)
               (decpomdp + *(long *)(*(long *)decpomdp + -0x40)));
    std::__cxx11::string::~string((string *)&ss);
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__cxx11::string::string<std::allocator<char>>(local_1d8,"GMAA",&local_2b1);
    directories::MADPGetResultsFilename
              ((string *)&sb,(MultiAgentDecisionProcessInterface *)local_1d8,
               (Arguments *)(decpomdp + *(long *)(*(long *)decpomdp + -0x40)));
    poVar2 = std::operator<<(local_1a8,(string *)&sb);
    GMAAtype::SoftPrint_abi_cxx11_((GMAA_t)local_1f8);
    poVar2 = std::operator<<(poVar2,local_1f8);
    poVar2 = std::operator<<(poVar2,"_");
    (**(code **)(*(long *)(q + *(long *)(*(long *)q + -0x60)) + 0x48))
              (local_218,q + *(long *)(*(long *)q + -0x60));
    poVar2 = std::operator<<(poVar2,local_218);
    poVar2 = std::operator<<(poVar2,"_h");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,args->horizon);
    poVar2 = std::operator<<(poVar2,"_restarts");
    std::ostream::operator<<(poVar2,args->nrRestarts);
    std::__cxx11::string::~string(local_218);
    std::__cxx11::string::~string(local_1f8);
    std::__cxx11::string::~string((string *)&sb);
    std::__cxx11::string::~string(local_1d8);
    if (args->useBGclustering != 0) {
      std::operator<<(local_1a8,"_Cluster");
      BayesianGameWithClusterInfo::SoftPrint_abi_cxx11_((BGClusterAlgorithm)&sb);
      std::operator<<(local_1a8,(string *)&sb);
      std::__cxx11::string::~string((string *)&sb);
      if (args->BGClusterAlgorithm != 0) {
        std::operator<<(local_1a8,"_tJB");
        poVar2 = std::ostream::_M_insert<double>(args->thresholdJB);
        std::operator<<(poVar2,"_tPjaoh");
        std::ostream::_M_insert<double>(args->thresholdPjaoh);
      }
    }
    if (args->gmaa == kGMAA) {
      poVar2 = std::operator<<(local_1a8,"_k");
      std::ostream::operator<<(poVar2,args->k);
    }
    pcVar5 = "_NoCache";
    if (args->cache_flat_models != false) {
      pcVar5 = "_CacheFM";
    }
    std::operator<<(local_1a8,pcVar5);
    if (GMAAusesBGIPSolver) {
      poVar2 = std::operator<<(local_1a8,"_");
      BGIP_SolverType::SoftPrint_abi_cxx11_((BGIP_Solver_t)&sb);
      std::operator<<(poVar2,(string *)&sb);
      std::__cxx11::string::~string((string *)&sb);
      switch(args->bgsolver) {
      case AM:
        poVar2 = std::operator<<(local_1a8,"_AM_restarts");
        std::ostream::operator<<(poVar2,args->nrAMRestarts);
        break;
      case CE:
        poVar2 = std::operator<<(local_1a8,"_CEr");
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        poVar2 = std::operator<<(poVar2,"_i");
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        poVar2 = std::operator<<(poVar2,"_s");
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        poVar2 = std::operator<<(poVar2,"_sfu");
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::operator<<(poVar2,"_a");
        poVar2 = std::ostream::_M_insert<double>(args->CE_alpha);
        poVar2 = std::operator<<(poVar2,"_ht");
        std::ostream::_M_insert<bool>(SUB81(poVar2,0));
        break;
      case BnB:
        poVar2 = std::operator<<(local_1a8,"_ka");
        poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
        poVar2 = std::operator<<(poVar2,"_JTO");
        BGIP_BnB::SoftPrint_abi_cxx11_((BnB_JointTypeOrdering)&sb);
        poVar2 = std::operator<<(poVar2,(string *)&sb);
        poVar2 = std::operator<<(poVar2,"_CCI");
        std::ostream::_M_insert<bool>(SUB81(poVar2,0));
        std::__cxx11::string::~string((string *)&sb);
        break;
      case Random:
        std::operator<<(local_1a8,"_Random");
      }
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)local_2b0,(string *)&sb);
    std::__cxx11::string::~string((string *)&sb);
    if (args->noReCompute != 0) {
      iVar1 = stat((local_2b0->_M_dataplus)._M_p,(stat *)&sb);
      if ((iVar1 == -1) && (piVar3 = __errno_location(), *piVar3 != 2)) {
        perror("stat");
LAB_00117bae:
        exit(0);
      }
      if ((iVar1 != -1) && ((sb.st_mode & 0xf000) != 0x8000 || sb.st_size != 0)) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Results file ");
        poVar2 = std::operator<<(poVar2,(string *)local_2b0);
        poVar2 = std::operator<<(poVar2," already exists, not recomputing it.");
        std::endl<char,std::char_traits<char>>(poVar2);
        goto LAB_00117bae;
      }
    }
    if (args->dryrun == 0) {
      std::ofstream::open((char *)of,(_Ios_Openmode)(local_2b0->_M_dataplus)._M_p);
      if (((byte)of[*(long *)(*(long *)of + -0x18) + 0x20] & 5) != 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"GMAA: could not open ");
        poVar2 = std::operator<<(poVar2,(string *)local_2b0);
        std::endl<char,std::char_traits<char>>(poVar2);
        poVar2 = std::operator<<((ostream *)&std::cout,"Results will not be stored to disk.");
        std::endl<char,std::char_traits<char>>(poVar2);
        args->dryrun = 1;
      }
      __lhs = local_2b0;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sb,
                     local_2b0,"_Timings");
      std::__cxx11::string::operator=((string *)timingsFilename,(string *)&sb);
      std::__cxx11::string::~string((string *)&sb);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sb,__lhs,
                     "_JPol");
      std::__cxx11::string::operator=((string *)jpolFilename,(string *)&sb);
      std::__cxx11::string::~string((string *)&sb);
      if ((args->dryrun == 0) &&
         (std::ofstream::open((char *)of_jpol,(_Ios_Openmode)(jpolFilename->_M_dataplus)._M_p),
         ((byte)of_jpol[*(long *)(*(long *)of_jpol + -0x18) + 0x20] & 5) != 0)) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar4 = "Could not open jpol file";
        __cxa_throw(puVar4,&char_const*::typeinfo,0);
      }
      if (-1 < args->verbose) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Computing ");
        std::__cxx11::stringbuf::str();
        poVar2 = std::operator<<(poVar2,(string *)&sb);
        std::endl<char,std::char_traits<char>>(poVar2);
        std::__cxx11::string::~string((string *)&sb);
      }
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  return;
}

Assistant:

void InitializeOutput(ArgumentHandlers::Arguments &args,
                      DecPOMDPDiscreteInterface* decpomdp,
                      QFunctionJAOHInterface *q,
                      bool GMAAusesBGIPSolver,
                      string &filename,
                      string &timingsFilename,
                      string &jpolFilename,
                      ofstream &of,
                      ofstream &of_jpol)
{
    if(!args.dryrun)
    {
        // Create results dir if it doesn't exist already
        try {
        directories::MADPCreateResultsDir("GMAA",*decpomdp);
        } catch(E& e)
        {
            e.Print();
            cout << "Results will not be stored to disk." << endl;
            args.dryrun=true;
        }

        stringstream ss;
        ss  << directories::MADPGetResultsFilename("GMAA",*decpomdp,args)
            << SoftPrint(args.gmaa)
            << "_" << q->SoftPrintBrief() << "_h" << args.horizon
            << "_restarts"<< args.nrRestarts;

        //check the method specific arguments 
        //and add them to file name
        if(args.useBGclustering)
        {
            ss << "_Cluster";
            ss  << BayesianGameWithClusterInfo::SoftPrint(
                        static_cast<BayesianGameWithClusterInfo::BGClusterAlgorithm>(args.BGClusterAlgorithm)
                    );
            if(args.BGClusterAlgorithm != BayesianGameWithClusterInfo::Lossless)
                ss << "_tJB" << args.thresholdJB << "_tPjaoh" << args.thresholdPjaoh;
        }
        switch(args.gmaa)
        {
        case MAAstar:
        case MAAstarClassic:
        case FSPC:
            break;
        case kGMAA: 
            ss << "_k" << args.k;
            break;
        }
        if(args.cache_flat_models)
            ss << "_CacheFM";
        else
            ss << "_NoCache";
        if(GMAAusesBGIPSolver)
        {
            ss << "_" << SoftPrint(args.bgsolver);
            // if not, we don't want to add these parameters to the
            // filename as they will not be used
            switch(args.bgsolver)
            {
            case BFS:
            case BFSNonInc:
                // BFS has no parameters
                break;
            case AM:
                ss << "_AM_restarts"<< args.nrAMRestarts;
                break;
            case CE:
                ss  << "_CEr" << args.nrCERestarts 
                    << "_i" << args.nrCEIterations
                    << "_s" << args.nrCESamples 
                    << "_sfu" << args.nrCESamplesForUpdate
                    << "_a" << args.CE_alpha 
                    << "_ht" << args.CE_use_hard_threshold;
                break;
            case MaxPlus:
                break;
            case BnB:
                ss << "_ka" << args.BnB_keepAll
                   << "_JTO" << SoftPrint(args.BnBJointTypeOrdering)
                   << "_CCI" << args.BnB_consistentCompleteInformationHeur;
                break;
            case CGBG_MaxPlus:
                break;
            case NDP:
                break;    
            case Random:
                ss << "_Random";
                break;
            }
        }

        filename=ss.str();

        if(args.noReCompute)
        {
            struct stat sb;
            bool fileExists=true;

            if (stat(filename.c_str(), &sb) == -1) {
                if(errno==ENOENT)
                    fileExists=false;
                else
                {
                    perror("stat");
                    exit(EXIT_SUCCESS);
                }
            }
            
            if(S_ISREG(sb.st_mode) &&
               sb.st_size==0)
                fileExists=false;
            
            if(fileExists)
            {
                cout << "Results file " << filename
                     << " already exists, not recomputing it." << endl;
                exit(0);
            }
        }

        if(!args.dryrun)
        {
            of.open(filename.c_str());
            if(!of)
            {
                cout << "GMAA: could not open " << filename << endl;
                cout << "Results will not be stored to disk." << endl;
                args.dryrun=true;
            }
            timingsFilename=filename + "_Timings";
            jpolFilename=filename + "_JPol";
            if(!args.dryrun)
            {
                of_jpol.open(jpolFilename.c_str());
                if(!of_jpol)
                    throw("Could not open jpol file");
            }
            if(args.verbose >= 0)
                cout << "Computing " << ss.str() << endl;
        }
    }
}